

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderCommonFunctionTests.cpp
# Opt level: O0

bool __thiscall
vkt::shaderexecutor::anon_unknown_0::SignCaseInstance::compare
          (SignCaseInstance *this,void **inputs,void **outputs)

{
  bool bVar1;
  int iVar2;
  const_reference pvVar3;
  ostream *poVar4;
  uint local_7c;
  float local_70;
  float local_6c;
  int ref0_1;
  int out0_1;
  int in0_1;
  int compNdx_1;
  float local_48;
  deUint32 ulpDiff0;
  float ref0;
  float out0;
  float in0;
  int compNdx;
  deUint32 maxUlpDiff;
  int scalarSize;
  Precision precision;
  DataType type;
  void **outputs_local;
  void **inputs_local;
  SignCaseInstance *this_local;
  
  _precision = outputs;
  outputs_local = inputs;
  inputs_local = (void **)this;
  pvVar3 = std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>::
           operator[](&(this->super_CommonFunctionTestInstance).m_spec.inputs,0);
  scalarSize = glu::VarType::getBasicType(&pvVar3->varType);
  pvVar3 = std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>::
           operator[](&(this->super_CommonFunctionTestInstance).m_spec.inputs,0);
  maxUlpDiff = glu::VarType::getPrecision(&pvVar3->varType);
  compNdx = glu::getDataTypeScalarSize(scalarSize);
  bVar1 = glu::isDataTypeFloatOrVec(scalarSize);
  if (bVar1) {
    if (maxUlpDiff == 0) {
      iVar2 = getMinMantissaBits(PRECISION_LOWP);
      local_6c = (float)getMaxUlpDiffFromBits(iVar2);
    }
    else {
      local_6c = 0.0;
    }
    in0 = local_6c;
    for (out0 = 0.0; (int)out0 < compNdx; out0 = (float)((int)out0 + 1)) {
      ref0 = *(float *)((long)*outputs_local + (long)(int)out0 * 4);
      ulpDiff0 = *(deUint32 *)((long)*_precision + (long)(int)out0 * 4);
      if (0.0 <= ref0) {
        local_70 = (float)(-(uint)(0.0 < ref0) & 0x3f800000);
      }
      else {
        local_70 = -1.0;
      }
      local_48 = local_70;
      compNdx_1 = getUlpDiff((float)ulpDiff0,local_70);
      if ((uint)in0 < (uint)compNdx_1) {
        poVar4 = std::operator<<((ostream *)&(this->super_CommonFunctionTestInstance).m_failMsg,
                                 "Expected [");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,(int)out0);
        poVar4 = std::operator<<(poVar4,"] = ");
        HexFloat::HexFloat((HexFloat *)&in0_1,local_48);
        poVar4 = anon_unknown_0::operator<<(poVar4,(HexFloat *)&in0_1);
        poVar4 = std::operator<<(poVar4," with ULP threshold ");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,(uint)in0);
        poVar4 = std::operator<<(poVar4,", got ULP diff ");
        std::ostream::operator<<(poVar4,compNdx_1);
        return false;
      }
    }
  }
  else {
    for (out0_1 = 0; out0_1 < compNdx; out0_1 = out0_1 + 1) {
      iVar2 = *(int *)((long)*outputs_local + (long)out0_1 * 4);
      if (iVar2 < 0) {
        local_7c = 0xffffffff;
      }
      else {
        local_7c = (uint)(0 < iVar2);
      }
      if (*(uint *)((long)*_precision + (long)out0_1 * 4) != local_7c) {
        poVar4 = std::operator<<((ostream *)&(this->super_CommonFunctionTestInstance).m_failMsg,
                                 "Expected [");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,out0_1);
        poVar4 = std::operator<<(poVar4,"] = ");
        std::ostream::operator<<(poVar4,local_7c);
        return false;
      }
    }
  }
  return true;
}

Assistant:

bool compare (const void* const* inputs, const void* const* outputs)
	{
		const glu::DataType		type			= m_spec.inputs[0].varType.getBasicType();
		const glu::Precision	precision		= m_spec.inputs[0].varType.getPrecision();
		const int				scalarSize		= glu::getDataTypeScalarSize(type);

		if (glu::isDataTypeFloatOrVec(type))
		{
			// Both highp and mediump should be able to represent -1, 0, and +1 exactly
			const deUint32 maxUlpDiff = precision == glu::PRECISION_LOWP ? getMaxUlpDiffFromBits(getMinMantissaBits(precision)) : 0;

			for (int compNdx = 0; compNdx < scalarSize; compNdx++)
			{
				const float		in0			= ((const float*)inputs[0])[compNdx];
				const float		out0		= ((const float*)outputs[0])[compNdx];
				const float		ref0		= in0 < 0.0f ? -1.0f :
											  in0 > 0.0f ? +1.0f : 0.0f;
				const deUint32	ulpDiff0	= getUlpDiff(out0, ref0);

				if (ulpDiff0 > maxUlpDiff)
				{
					m_failMsg << "Expected [" << compNdx << "] = " << HexFloat(ref0) << " with ULP threshold " << maxUlpDiff << ", got ULP diff " << ulpDiff0;
					return false;
				}
			}
		}
		else
		{
			for (int compNdx = 0; compNdx < scalarSize; compNdx++)
			{
				const int	in0		= ((const int*)inputs[0])[compNdx];
				const int	out0	= ((const int*)outputs[0])[compNdx];
				const int	ref0	= in0 < 0 ? -1 :
									  in0 > 0 ? +1 : 0;

				if (out0 != ref0)
				{
					m_failMsg << "Expected [" << compNdx << "] = " << ref0;
					return false;
				}
			}
		}

		return true;
	}